

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  iterator it;
  PositionType PVar2;
  bool bVar3;
  ReferenceType __src;
  PointerType pSVar4;
  PointerType pSVar5;
  long lVar6;
  PositionType *pPVar7;
  PositionType *pPVar8;
  byte bVar9;
  iterator iVar10;
  SnapshotDataType in_stack_fffffffffffffda8;
  cmLinkedTree<cmDefinitions> *local_128;
  PositionType local_120;
  iterator origin;
  undefined1 local_28 [8];
  PositionType pos;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  bVar9 = 0;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  pos.Position = (PositionType)originSnapshot;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(&origin.Position,__src,0xd0);
  pPVar7 = &origin.Position;
  pPVar8 = (PositionType *)&stack0xfffffffffffffda8;
  for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pPVar8 = *pPVar7;
    pPVar7 = pPVar7 + (ulong)bVar9 * -2 + 1;
    pPVar8 = pPVar8 + (ulong)bVar9 * -2 + 1;
  }
  _local_28 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,it,in_stack_fffffffffffffda8);
  PVar2 = pos.Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar4->ScopeParent).Tree = *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(PVar2 + 8);
  (pSVar4->ScopeParent).Position = *(PositionType *)(PVar2 + 0x10);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar4->SnapshotType = VariableScopeType;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar5->PolicyScope).Tree = (pSVar4->Policies).Tree;
  (pSVar5->PolicyScope).Position = (pSVar4->Policies).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  bVar3 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (!bVar3) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x33d,
                  "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pcVar1 = (pSVar4->Vars).Tree;
  origin.Tree = (cmLinkedTree<cmDefinitions> *)(pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar4->Parent).Tree = pcVar1;
  (pSVar4->Parent).Position = (PositionType)origin.Tree;
  iVar10.Position = (PositionType)origin.Tree;
  iVar10.Tree = pcVar1;
  iVar10 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar10);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  local_128 = iVar10.Tree;
  (pSVar4->Vars).Tree = local_128;
  local_120 = iVar10.Position;
  (pSVar4->Vars).Position = local_120;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  bVar3 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (!bVar3) {
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x342,
                  "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
  }
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_28);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateVariableScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmStateSnapshot(this, pos);
}